

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::SooRep::set_non_soo
          (SooRep *this,bool was_soo,int capacity,void *elements)

{
  int iVar1;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar2;
  void *ptr;
  RepeatedField<long> *this_00;
  uint size;
  uint extraout_EDX;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong *puVar7;
  LongSooRep *pLVar8;
  SooRep *pSVar9;
  Arena *this_01;
  bool bVar10;
  ulong uVar11;
  Arena *pAStack_120;
  long lStack_118;
  SooRep *pSStack_110;
  Arena aAStack_108 [16];
  LongSooRep *pLStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  SooRep SStack_d8;
  ulong *puStack_c8;
  code *pcStack_c0;
  LongSooRep LStack_b8;
  ulong uStack_a8;
  SooRep *pSStack_a0;
  code *pcStack_98;
  ulong auStack_90 [2];
  void *pvStack_80;
  SooRep *pSStack_78;
  ulong uStack_70;
  undefined1 auStack_60 [24];
  LongSooRep LStack_48;
  ulong local_30 [2];
  
  uVar4 = (this->field_0).long_rep.elements_int;
  if (((uVar4 & 4) == 0) == was_soo) {
    psVar2 = (string *)0x0;
  }
  else {
    LStack_48.size = 0x145776;
    LStack_48.capacity = 0;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (was_soo,(uVar4 & 4) == 0,"was_soo == is_soo()");
  }
  if (psVar2 == (string *)0x0) {
    if (elements == (void *)0x0) {
      LStack_48.size = 0x145788;
      LStack_48.capacity = 0;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                         ((void *)0x0,(void *)0x0,"elements != nullptr");
    }
    else {
      psVar2 = (string *)0x0;
    }
    if (psVar2 != (string *)0x0) goto LAB_001457a7;
    if (((ulong)elements & 7) == 0) {
      psVar2 = (string *)0x0;
    }
    else {
      LStack_48.size = 0x145798;
      LStack_48.capacity = 0;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((ulong)elements & 7,0,
                          "reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment == uintptr_t{0}"
                         );
    }
    if (psVar2 == (string *)0x0) {
      if (was_soo) {
        (this->field_0).long_rep.size = *(uint *)&this->field_0 & 3;
      }
      (this->field_0).long_rep.capacity = capacity;
      (this->field_0).long_rep.elements_int = (ulong)elements | 4;
      return;
    }
  }
  else {
    LStack_48.size = 0x1457a7;
    LStack_48.capacity = 0;
    set_non_soo();
LAB_001457a7:
    LStack_48.size = 0x1457b4;
    LStack_48.capacity = 0;
    set_non_soo();
    psVar2 = extraout_RAX;
  }
  puVar7 = local_30;
  LStack_48.size = 0x1457c1;
  LStack_48.capacity = 0;
  set_non_soo();
  if ((*puVar7 & 4) == 0) {
    return;
  }
  pLVar8 = &LStack_48;
  auStack_60._8_8_ = RepeatedField<int>::heap_rep;
  soo_arena();
  if ((pLVar8->elements_int & 4) != 0) {
    uStack_70 = 0x1457ea;
    LongSooRep::elements(pLVar8);
    return;
  }
  pSVar9 = (SooRep *)auStack_60;
  uStack_70 = 0x1457fd;
  RepeatedField<int>::heap_rep();
  puVar7 = auStack_90;
  uVar4 = (ulong)psVar2 & 0xffffffff;
  iVar6 = 2;
  if ((int)psVar2 == 0) {
    iVar6 = (pSVar9->field_0).long_rep.capacity;
  }
  pvStack_80 = elements;
  pSStack_78 = this;
  uStack_70 = (ulong)(uint)capacity;
  if (iVar6 < (int)size) {
    pcStack_98 = (code *)0x14584d;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)size,(long)iVar6,"size <= Capacity(is_soo)");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    set_size(pSVar9,SUB81(uVar4,0),size);
    return;
  }
  pcStack_98 = set_size;
  RepeatedField<int>::set_size();
  pLVar8 = &LStack_b8;
  uVar5 = (ulong)extraout_EDX;
  uVar11 = (ulong)psVar2 & 0xffffffff;
  bVar10 = SUB81(uVar11,0);
  uStack_a8 = (ulong)size;
  pSStack_a0 = pSVar9;
  pcStack_98 = (code *)uVar4;
  if (((*puVar7 & 4) == 0) == bVar10) {
    psVar2 = (string *)0x0;
  }
  else {
    pcStack_c0 = (code *)0x1458c5;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar10,(*puVar7 & 4) == 0,"is_soo == this->is_soo()");
  }
  if (psVar2 == (string *)0x0) {
    if (bVar10 == false) {
      *(uint *)(puVar7 + 1) = extraout_EDX;
    }
    else {
      if ((int)extraout_EDX < 4) {
        psVar2 = (string *)0x0;
      }
      else {
        pcStack_c0 = (code *)0x1458da;
        psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (uVar5,3,"size <= kSooSizeMask");
      }
      if (psVar2 != (string *)0x0) goto LAB_001458e7;
      *puVar7 = (long)(int)extraout_EDX | *puVar7 & 0xfffffffffffffff8;
    }
    return;
  }
  pcStack_c0 = (code *)0x1458e7;
  set_size();
  psVar2 = extraout_RAX_00;
LAB_001458e7:
  pcStack_c0 = RepeatedField<long>::elements;
  set_size();
  uVar4 = (ulong)psVar2 & 0xffffffff;
  iVar6 = 1;
  if ((int)psVar2 == 0) {
    iVar6 = pLVar8->capacity;
  }
  puStack_c8 = puVar7;
  pcStack_c0 = (code *)uVar5;
  if (iVar6 < 1) {
    uStack_e8 = 0x145946;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar6,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if ((char)uVar4 != '\0') {
      return;
    }
    LongSooRep::elements(pLVar8);
    return;
  }
  pSVar9 = &SStack_d8;
  uStack_e8 = 0x145955;
  RepeatedField<long>::elements();
  this_01 = aAStack_108;
  iVar6 = (int)psVar2;
  lVar3 = (long)iVar6;
  pLStack_f8 = pLVar8;
  uStack_f0 = uVar11;
  uStack_e8 = uVar4;
  if (iVar6 < 0) {
    pSStack_110 = (SooRep *)0x1459be;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar3,0,"index >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    pSStack_110 = (SooRep *)0x145983;
    iVar1 = SooRep::size(pSVar9,(undefined1  [16])
                                ((undefined1  [16])pSVar9->field_0 & (undefined1  [16])0x4) ==
                                (undefined1  [16])0x0);
    if (iVar6 < iVar1) {
      psVar2 = (string *)0x0;
    }
    else {
      pSStack_110 = (SooRep *)0x1459d2;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar3,(long)iVar1,"index < size()");
    }
    if (psVar2 == (string *)0x0) {
      pSStack_110 = (SooRep *)0x1459a0;
      RepeatedField<long>::elements
                ((RepeatedField<long> *)pSVar9,
                 (undefined1  [16])((undefined1  [16])pSVar9->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  else {
    pSStack_110 = (SooRep *)0x1459df;
    RepeatedField<long>::Mutable();
  }
  pSStack_110 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>;
  RepeatedField<long>::Mutable();
  lStack_118 = lVar3;
  pSStack_110 = pSVar9;
  if (this_01 == (Arena *)0x0) {
    this_00 = (RepeatedField<long> *)operator_new(0x10);
    RepeatedField<long>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_01,0x10);
    pAStack_120 = this_01;
    Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_120);
  }
  return;
}

Assistant:

void set_non_soo(bool was_soo, int capacity, void* elements) {
    ABSL_DCHECK_EQ(was_soo, is_soo());
    ABSL_DCHECK_NE(elements, nullptr);
    ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment,
                   uintptr_t{0});
    if (was_soo) long_rep.size = short_rep.size();
    long_rep.capacity = capacity;
    long_rep.elements_int = reinterpret_cast<uintptr_t>(elements) | kNotSooBit;
  }